

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPrimal.cpp
# Opt level: O2

void __thiscall HPrimal::primalRebuild(HPrimal *this)

{
  uint uVar1;
  uint uVar2;
  HModel *this_00;
  double dVar3;
  double dVar4;
  
  HModel::recordPivots(this->model,-1,-1,0.0);
  dVar3 = HTimer::getTime(&this->model->timer);
  uVar1 = this->invertHint;
  this->invertHint = 0;
  this_00 = this->model;
  if (((uVar1 != 3 | this_00->InvertIfRowOutNeg) == 1) && (0 < this_00->countUpdate)) {
    HModel::computeFactor(this_00);
    this->countUpdate = 0;
    this_00 = this->model;
  }
  HModel::computeDual(this_00);
  HModel::computePrimal(this->model);
  HModel::computeDuObj(this->model,2);
  HModel::util_reportNumberIterationObjectiveValue(this->model);
  dVar4 = HTimer::getTime(&this->model->timer);
  uVar2 = this->totalRebuilds + 1;
  this->totalRebuilds = uVar2;
  this->totalRebuildTime = this->totalRebuildTime + (dVar4 - dVar3);
  printf("Primal     rebuild %d (%1d) on iteration %9d: Rebuild time = %g; Total rebuild time %g\n",
         (ulong)uVar2,(ulong)uVar1,(ulong)(uint)this->model->numberIteration);
  this->model->mlFg_haveFreshRebuild = 1;
  return;
}

Assistant:

void HPrimal::primalRebuild() {
    model->recordPivots(-1, -1, 0); // Indicate REINVERT
#ifdef JAJH_dev
    //    double tt0 = model->timer.getTime();
#endif
    double tt0 = model->timer.getTime();

    // Rebuild model->factor - only if we got updates
    int sv_invertHint = invertHint;
    invertHint = invertHint_no; // Was 0
    // Possibly Rebuild model->factor
    bool reInvert = model->countUpdate > 0;
    if (!model->InvertIfRowOutNeg) {
      // Don't reinvert if rowOut is negative [equivalently, if sv_invertHint == invertHint_possiblyOptimal]
      if (sv_invertHint == invertHint_possiblyOptimal) {
	assert(columnIn == -1);
	reInvert = false;
      }
    }
    if (reInvert) {
        model->computeFactor();
        countUpdate = 0;
    }
    model->computeDual();
    model->computePrimal();
    model->computeDuObj();
    model->util_reportNumberIterationObjectiveValue();

    double rebuildTime = model->timer.getTime()-tt0;
    totalRebuilds++;
    totalRebuildTime += rebuildTime;
#ifdef JAJH_dev
    printf("Primal     rebuild %d (%1d) on iteration %9d: Rebuild time = %g; Total rebuild time %g\n",
	   totalRebuilds, sv_invertHint, model->numberIteration, rebuildTime, totalRebuildTime);
#endif
    //Data are fresh from rebuild
    model->mlFg_haveFreshRebuild = 1;
}